

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O1

void libdef_name(char *p,int kind)

{
  uint8_t *__dest;
  uint uVar1;
  char *__s;
  size_t sVar2;
  uint8_t *puVar3;
  int iVar4;
  size_t sVar5;
  uint uVar6;
  BuildCtx *ctx;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uint8_t *puVar10;
  int *piVar11;
  undefined8 uStack_140;
  ulong uStack_138;
  undefined4 uStack_130;
  undefined8 uStack_12c;
  undefined4 uStack_124;
  undefined4 uStack_120;
  int iStack_11c;
  undefined2 uStack_118;
  undefined8 uStack_114;
  int iStack_10c;
  int iStack_108;
  undefined4 uStack_104;
  undefined1 auStack_100 [44];
  undefined2 uStack_d4;
  undefined4 uStack_c8;
  int iStack_c4;
  int iStack_c0;
  undefined2 uStack_b8;
  undefined8 uStack_b4;
  undefined2 uStack_ac;
  undefined4 uStack_a0;
  int iStack_9c;
  int iStack_98;
  undefined2 uStack_90;
  undefined4 uStack_8c;
  undefined8 uStack_88;
  int iStack_78;
  int iStack_74;
  undefined4 uStack_64;
  BuildCtx *pBStack_58;
  
  ctx = (BuildCtx *)p;
  sVar5 = strlen(p);
  sVar2 = modnamelen;
  if (((kind != 0xc0) && (modnamelen < sVar5)) && (p[modnamelen] == '_')) {
    ctx = (BuildCtx *)p;
    iVar4 = strncmp(p,modname,modnamelen);
    if (iVar4 == 0) {
      p = p + sVar2 + 1;
      sVar5 = sVar5 - (sVar2 + 1);
    }
  }
  if (sVar5 < 0x39) {
    if (optr + sVar5 + 3 < (uint8_t *)((long)&optr + 1U)) {
      __dest = optr + 1;
      puVar10 = optr + sVar5 + 1;
      puVar3 = __dest;
      *optr = (byte)kind | (byte)sVar5;
      optr = puVar3;
      memcpy(__dest,p,sVar5);
      optr = puVar10;
      return;
    }
  }
  else {
    ctx = (BuildCtx *)p;
    libdef_name_cold_2();
  }
  libdef_name_cold_1();
  pBStack_58 = (BuildCtx *)p;
  memset(auStack_100 + 5,0,0x9b);
  auStack_100[0] = '.';
  auStack_100[1] = 't';
  auStack_100[2] = 'e';
  auStack_100[3] = 'x';
  auStack_100[4] = 't';
  auStack_100._20_4_ = 0xb4;
  auStack_100._16_4_ = (undefined4)ctx->codesz;
  auStack_100._24_4_ = auStack_100._16_4_ + 0xb4;
  uVar6 = ctx->nreloc & 0xffff;
  auStack_100._32_2_ = (undefined2)ctx->nreloc;
  iVar4 = auStack_100._16_4_ + 0xb4 + uVar6 * 10;
  auStack_100._36_8_ = 0x6164702e60500020;
  uStack_d4 = 0x6174;
  uStack_c8 = 0x18;
  iStack_c0 = auStack_100._16_4_ + 0xcc + uVar6 * 10;
  uStack_b8 = 6;
  iStack_9c = auStack_100._16_4_ + 0x108 + uVar6 * 10;
  uStack_b4 = 0x6164782e40300040;
  uStack_ac = 0x6174;
  uStack_a0 = 0x20;
  iStack_98 = auStack_100._16_4_ + 0x128 + uVar6 * 10;
  uStack_90 = 1;
  iStack_74 = auStack_100._16_4_ + 0x132 + uVar6 * 10;
  uStack_8c = 0x40300040;
  uStack_88 = 0x5a2461746164722e;
  iStack_c4 = iVar4;
  sVar5 = strlen(ctx->dasm_ident);
  iStack_78 = (int)sVar5 + 1;
  iStack_10c = (int)sVar5 + iVar4 + 0x7f;
  uStack_64 = 0x40300040;
  uStack_114 = 0x48664;
  uStack_104 = 0;
  uVar6 = ctx->nrelocsym;
  iStack_108 = uVar6 + 0xb + ctx->nsym;
  owrite(ctx,&uStack_114,0x14);
  owrite(ctx,auStack_100,0xa0);
  owrite(ctx,ctx->code,ctx->codesz);
  if (0 < ctx->nreloc) {
    piVar11 = &ctx->reloc[0].type;
    lVar7 = 0;
    do {
      uStack_140 = CONCAT44(piVar11[-1] + 3,((BuildReloc *)(piVar11 + -2))->ofs);
      uStack_138 = CONCAT62(uStack_138._2_6_,(*piVar11 != 0) + 2 + (ushort)(*piVar11 != 0));
      owrite(ctx,&uStack_140,10);
      lVar7 = lVar7 + 1;
      piVar11 = piVar11 + 3;
    } while (lVar7 < ctx->nreloc);
  }
  uVar1 = ctx->sym[(long)ctx->nsym + -1].ofs;
  uStack_140 = (ulong)uVar1 << 0x20;
  uStack_138 = uStack_138 & 0xffffffff00000000;
  owrite(ctx,&uStack_140,0xc);
  uStack_140 = CONCAT44((int)ctx->codesz,uVar1);
  uStack_138 = CONCAT44(uStack_138._4_4_,0x14);
  owrite(ctx,&uStack_140,0xc);
  uStack_120 = 0;
  iVar4 = uVar6 + 8;
  uStack_118 = 3;
  iStack_11c = iVar4;
  owrite(ctx,&uStack_120,10);
  uStack_120 = 4;
  uStack_118 = 3;
  iStack_11c = iVar4;
  owrite(ctx,&uStack_120,10);
  uStack_120 = 8;
  uStack_118 = 3;
  iStack_11c = uVar6 + 5;
  owrite(ctx,&uStack_120,10);
  uStack_120 = 0xc;
  uStack_118 = 3;
  iStack_11c = iVar4;
  owrite(ctx,&uStack_120,10);
  uStack_120 = 0x10;
  uStack_118 = 3;
  iStack_11c = iVar4;
  owrite(ctx,&uStack_120,10);
  uStack_120 = 0x14;
  uStack_118 = 3;
  iStack_11c = uVar6 + 5;
  owrite(ctx,&uStack_120,10);
  uStack_140 = 0x3000420000050019;
  uStack_138 = 0x500070006000;
  uStack_130 = 0;
  uStack_12c = 0x200030015040001;
  uStack_124 = 0x50003000;
  owrite(ctx,&uStack_140,0x20);
  uStack_120 = 0x10;
  uStack_118 = 3;
  iStack_11c = uVar6 + 7;
  owrite(ctx,&uStack_120,10);
  __s = ctx->dasm_ident;
  sVar5 = strlen(__s);
  owrite(ctx,__s,sVar5 + 1);
  strtab = (char *)0x0;
  while( true ) {
    strtabofs = 4;
    emit_peobj_sym(ctx,"@feat.00",1,-2,0,3);
    emit_peobj_sym_sect(ctx,(PEsection *)auStack_100,0);
    if (0 < (int)uVar6) {
      uVar8 = 0;
      do {
        emit_peobj_sym(ctx,ctx->relocsym[uVar8],0,-1,0x20,2);
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
    }
    emit_peobj_sym_sect(ctx,(PEsection *)auStack_100,1);
    emit_peobj_sym_sect(ctx,(PEsection *)auStack_100,2);
    emit_peobj_sym(ctx,"lj_err_unwind_win",0,-1,0x20,2);
    emit_peobj_sym(ctx,ctx->beginsym,0,0,0,2);
    if (0 < ctx->nsym) {
      lVar7 = 8;
      lVar9 = 0;
      do {
        emit_peobj_sym(ctx,*(char **)((long)ctx->sym + lVar7 + -8),
                       *(uint32_t *)((long)&ctx->sym->name + lVar7),0,0x20,2);
        lVar9 = lVar9 + 1;
        lVar7 = lVar7 + 0x10;
      } while (lVar9 < ctx->nsym);
    }
    emit_peobj_sym_sect(ctx,(PEsection *)auStack_100,3);
    sVar2 = strtabofs;
    if (strtab != (char *)0x0) break;
    strtab = (char *)malloc(strtabofs);
    *(int *)strtab = (int)sVar2;
  }
  owrite(ctx,strtab,strtabofs);
  return;
}

Assistant:

static void libdef_name(const char *p, int kind)
{
  size_t n = strlen(p);
  if (kind != LIBINIT_STRING) {
    if (n > modnamelen && p[modnamelen] == '_' &&
	!strncmp(p, modname, modnamelen)) {
      p += modnamelen+1;
      n -= modnamelen+1;
    }
  }
  if (n > LIBINIT_MAXSTR) {
    fprintf(stderr, "Error: string too long: '%s'\n",  p);
    exit(1);
  }
  if (optr+1+n+2 > obuf+sizeof(obuf)) {  /* +2 for caller. */
    fprintf(stderr, "Error: output buffer overflow\n");
    exit(1);
  }
  *optr++ = (uint8_t)(n | kind);
  memcpy(optr, p, n);
  optr += n;
}